

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Abc_NtkFxCheck(Abc_Ntk_t *pNtk)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  Abc_Obj_t *pAVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int i;
  
  i = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      return 1;
    }
    pAVar4 = Abc_NtkObj(pNtk,i);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      uVar2 = (pAVar4->vFanins).nSize;
      uVar5 = 0;
      if (0 < (int)uVar2) {
        uVar5 = (ulong)uVar2;
      }
      lVar6 = 1;
      uVar7 = 0;
      while (uVar7 != uVar5) {
        lVar8 = lVar6;
        while ((int)lVar8 < (int)uVar2) {
          piVar3 = (pAVar4->vFanins).pArray;
          piVar1 = piVar3 + lVar8;
          lVar8 = lVar8 + 1;
          if (piVar3[uVar7] == *piVar1) {
            return 0;
          }
        }
        lVar6 = lVar6 + 1;
        uVar7 = uVar7 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_NtkFxCheck( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
//    Abc_NtkForEachObj( pNtk, pNode, i )
//        Abc_ObjPrint( stdout, pNode );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Vec_IntCheckUniqueSmall( &pNode->vFanins ) )
            return 0;
    return 1;
}